

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Animatable<tinyusdz::value::AssetPath>::get_scalar
          (Animatable<tinyusdz::value::AssetPath> *this,AssetPath *v)

{
  if (((v != (AssetPath *)0x0) && (this->_blocked == false)) && (this->_has_value == true)) {
    tinyusdz::value::AssetPath::operator=(v,&this->_value);
    return true;
  }
  return false;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }